

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::split_node
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint index)

{
  uint *puVar1;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  void *pvVar7;
  void *p;
  bool bVar8;
  vq_node *pvVar9;
  bool bVar10;
  uint uVar11;
  vq_node *pvVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  float *pfVar17;
  uint min_new_capacity;
  ulong uVar18;
  float dist2;
  float fVar19;
  float dist2_1;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  undefined1 local_c0 [8];
  undefined1 local_b8 [20];
  float local_a4;
  elemental_vector *local_a0;
  vq_node *local_98;
  ulong local_90;
  ulong local_88;
  double local_80;
  double local_78;
  uint local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ulong local_48;
  elemental_vector *local_40;
  elemental_vector *local_38;
  
  local_98 = (this->m_nodes).m_p;
  if (local_98[index].m_vectors.m_size == 1) {
    return;
  }
  local_98 = local_98 + index;
  if (this->m_quick == true) {
    compute_split_estimate(this,(vec<2U,_float> *)local_b8,(vec<2U,_float> *)local_c0,local_98);
  }
  else {
    compute_split_pca(this,(vec<2U,_float> *)local_b8,(vec<2U,_float> *)local_c0,local_98);
  }
  local_a0 = (elemental_vector *)&this->m_nodes;
  local_6c = 8;
  if (this->m_quick != false) {
    local_6c = 2;
  }
  local_38 = (elemental_vector *)&this->m_left_children;
  local_40 = (elemental_vector *)&this->m_right_children;
  uVar15 = 0;
  local_a4 = 1e+10;
  pvVar9 = local_98;
  local_b8._8_8_ = this;
  do {
    if ((this->m_left_children).m_size != 0) {
      (this->m_left_children).m_size = 0;
    }
    if ((this->m_right_children).m_size != 0) {
      (this->m_right_children).m_size = 0;
    }
    if ((pvVar9->m_vectors).m_size == 0) {
LAB_001446ef:
      pvVar9->m_unsplittable = true;
      return;
    }
    local_58 = 0.0;
    fVar24 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
    dVar31 = 0.0;
    uVar18 = 0;
    local_90 = 0;
    local_88 = 0;
    dVar30 = 0.0;
    local_68 = 0.0;
    fVar27 = 0.0;
    fVar28 = 0.0;
    fVar29 = 0.0;
    local_48 = uVar15;
    do {
      puVar6 = (pvVar9->m_vectors).m_p;
      uVar16 = puVar6[uVar18];
      ppVar2 = (this->m_training_vecs).m_p + uVar16;
      uVar15 = (ulong)ppVar2->second;
      fVar19 = 0.0;
      lVar13 = 0;
      pfVar17 = (float *)local_b8;
      bVar8 = true;
      do {
        bVar10 = bVar8;
        fVar20 = *pfVar17 - (ppVar2->first).m_s[lVar13];
        fVar19 = fVar19 + fVar20 * fVar20;
        lVar13 = 1;
        pfVar17 = (float *)(local_b8 + 4);
        bVar8 = false;
      } while (bVar10);
      fVar20 = 0.0;
      lVar13 = 0;
      pfVar17 = (float *)local_c0;
      bVar8 = true;
      do {
        bVar10 = bVar8;
        fVar21 = *pfVar17 - (ppVar2->first).m_s[lVar13];
        fVar20 = fVar20 + fVar21 * fVar21;
        lVar13 = 1;
        pfVar17 = (float *)(local_c0 + 4);
        bVar8 = false;
      } while (bVar10);
      if (fVar20 <= fVar19) {
        uVar14 = (this->m_right_children).m_size;
        if ((this->m_right_children).m_capacity <= uVar14) {
          local_80 = dVar31;
          local_78 = dVar30;
          fStack_64 = fVar27;
          fStack_60 = fVar28;
          fStack_5c = fVar29;
          fStack_54 = fVar24;
          fStack_50 = fVar25;
          fStack_4c = fVar26;
          elemental_vector::increase_capacity(local_40,uVar14 + 1,true,4,(object_mover)0x0,false);
          uVar14 = ((vector<unsigned_int> *)(local_b8._8_8_ + 0x60))->m_size;
          uVar16 = puVar6[uVar18];
          this = (clusterizer<crnlib::vec<2U,_float>_> *)local_b8._8_8_;
          pvVar9 = local_98;
          fVar24 = fStack_54;
          fVar25 = fStack_50;
          fVar26 = fStack_4c;
          fVar27 = fStack_64;
          fVar28 = fStack_60;
          fVar29 = fStack_5c;
          dVar30 = local_78;
          dVar31 = local_80;
        }
        (this->m_right_children).m_p[uVar14] = uVar16;
        puVar1 = &(this->m_right_children).m_size;
        *puVar1 = *puVar1 + 1;
        fVar19 = (float)uVar15;
        uVar3 = *(undefined8 *)(ppVar2->first).m_s;
        fVar20 = (float)uVar3;
        fVar21 = (float)((ulong)uVar3 >> 0x20);
        local_68 = local_68 + fVar19 * fVar20;
        fVar27 = fVar27 + fVar19 * fVar21;
        fVar28 = fVar28 + fVar19 * 0.0;
        fVar29 = fVar29 + fVar19 * 0.0;
        local_88 = local_88 + uVar15;
        dVar30 = dVar30 + (double)((fVar21 * fVar21 + fVar20 * fVar20) * fVar19);
      }
      else {
        uVar14 = (this->m_left_children).m_size;
        if ((this->m_left_children).m_capacity <= uVar14) {
          local_80 = dVar31;
          local_78 = dVar30;
          fStack_64 = fVar27;
          fStack_60 = fVar28;
          fStack_5c = fVar29;
          fStack_54 = fVar24;
          fStack_50 = fVar25;
          fStack_4c = fVar26;
          elemental_vector::increase_capacity(local_38,uVar14 + 1,true,4,(object_mover)0x0,false);
          uVar14 = ((vector<unsigned_int> *)(local_b8._8_8_ + 0x50))->m_size;
          uVar16 = puVar6[uVar18];
          this = (clusterizer<crnlib::vec<2U,_float>_> *)local_b8._8_8_;
          pvVar9 = local_98;
          fVar24 = fStack_54;
          fVar25 = fStack_50;
          fVar26 = fStack_4c;
          fVar27 = fStack_64;
          fVar28 = fStack_60;
          fVar29 = fStack_5c;
          dVar30 = local_78;
          dVar31 = local_80;
        }
        (this->m_left_children).m_p[uVar14] = uVar16;
        puVar1 = &(this->m_left_children).m_size;
        *puVar1 = *puVar1 + 1;
        fVar19 = (float)uVar15;
        uVar3 = *(undefined8 *)(ppVar2->first).m_s;
        fVar20 = (float)uVar3;
        fVar21 = (float)((ulong)uVar3 >> 0x20);
        local_58 = local_58 + fVar19 * fVar20;
        fVar24 = fVar24 + fVar19 * fVar21;
        fVar25 = fVar25 + fVar19 * 0.0;
        fVar26 = fVar26 + fVar19 * 0.0;
        local_90 = local_90 + uVar15;
        dVar31 = dVar31 + (double)((fVar21 * fVar21 + fVar20 * fVar20) * fVar19);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (pvVar9->m_vectors).m_size);
    if ((local_90 == 0) || (local_88 == 0)) goto LAB_001446ef;
    fVar29 = (float)(dVar31 - (double)((fVar24 * fVar24 + local_58 * local_58) / (float)local_90));
    fVar28 = (float)(dVar30 - (double)((fVar27 * fVar27 + local_68 * local_68) / (float)local_88));
    fVar26 = 1.0 / (float)local_90;
    fVar25 = 1.0 / (float)local_88;
    fVar22 = fVar26 * local_58;
    fVar23 = fVar26 * fVar24;
    local_b8._0_4_ = fVar22;
    local_b8._4_4_ = fVar23;
    local_c0._0_4_ = fVar25 * local_68;
    local_c0._4_4_ = fVar25 * fVar27;
    fVar24 = fVar29 + fVar28;
  } while (((1e-05 <= fVar24) && (0.00125 <= (local_a4 - fVar24) / fVar24)) &&
          (uVar16 = (int)local_48 + 1, uVar15 = (ulong)uVar16, local_a4 = fVar24, uVar16 != local_6c
          ));
  uVar16 = (this->m_nodes).m_size;
  uVar14 = uVar16 + 1;
  pvVar9->m_left = uVar16;
  pvVar9->m_right = uVar14;
  uVar4 = this->m_split_index;
  min_new_capacity = uVar16 + 2;
  pvVar9->m_codebook_index = uVar4;
  this->m_split_index = uVar4 + 1;
  local_68 = fVar29;
  local_58 = fVar28;
  if (uVar16 >> 1 < 0x7fffffff) {
    if ((this->m_nodes).m_capacity < min_new_capacity) {
      elemental_vector::increase_capacity
                (local_a0,min_new_capacity,false,0x38,
                 vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,false);
      uVar5 = (this->m_nodes).m_size;
      uVar11 = min_new_capacity - uVar5;
      if (uVar11 == 0) goto LAB_0014477d;
      pvVar9 = ((node_vec_type *)(local_b8._8_8_ + 0x10))->m_p + uVar5;
      pvVar12 = pvVar9 + uVar11;
    }
    else {
      lVar13 = (ulong)uVar16 * 0x38;
      pvVar9 = (vq_node *)((long)local_a0->m_p + lVar13);
      pvVar12 = (vq_node *)((long)local_a0->m_p + lVar13 + 0x70);
    }
    do {
      (pvVar9->m_vectors).m_p = (uint *)0x0;
      (pvVar9->m_vectors).m_size = 0;
      (pvVar9->m_vectors).m_capacity = 0;
      *(undefined8 *)(pvVar9->m_centroid).m_s = 0;
      pvVar9->m_total_weight = 0;
      pvVar9->m_left = -1;
      pvVar9->m_right = -1;
      pvVar9->m_codebook_index = -1;
      pvVar9->m_unsplittable = false;
      pvVar9 = pvVar9 + 1;
    } while (pvVar9 != pvVar12);
  }
  else {
    pvVar7 = local_a0->m_p;
    lVar13 = 0;
    do {
      p = *(void **)((long)pvVar7 + lVar13 + (ulong)min_new_capacity * 0x38 + 0x18);
      if (p != (void *)0x0) {
        crnlib_free(p);
      }
      lVar13 = lVar13 + 0x38;
    } while (lVar13 != 0x37ffffff90);
  }
LAB_0014477d:
  uVar15 = local_88;
  ((node_vec_type *)(local_b8._8_8_ + 0x10))->m_size = min_new_capacity;
  pvVar9 = ((node_vec_type *)(local_b8._8_8_ + 0x10))->m_p;
  pvVar12 = pvVar9 + uVar16;
  if (pvVar12 != (vq_node *)local_b8) {
    (pvVar12->m_centroid).m_s[0] = (float)local_b8._0_4_;
    (pvVar12->m_centroid).m_s[1] = (float)local_b8._4_4_;
  }
  pvVar9 = pvVar9 + uVar14;
  pvVar12->m_total_weight = local_90;
  puVar6 = (pvVar12->m_vectors).m_p;
  (pvVar12->m_vectors).m_p = ((vector<unsigned_int> *)(local_b8._8_8_ + 0x50))->m_p;
  ((vector<unsigned_int> *)(local_b8._8_8_ + 0x50))->m_p = puVar6;
  uVar4 = (pvVar12->m_vectors).m_size;
  (pvVar12->m_vectors).m_size = ((vector<unsigned_int> *)(local_b8._8_8_ + 0x50))->m_size;
  ((vector<unsigned_int> *)(local_b8._8_8_ + 0x50))->m_size = uVar4;
  uVar4 = (pvVar12->m_vectors).m_capacity;
  (pvVar12->m_vectors).m_capacity = ((vector<unsigned_int> *)(local_b8._8_8_ + 0x50))->m_capacity;
  ((vector<unsigned_int> *)(local_b8._8_8_ + 0x50))->m_capacity = uVar4;
  pvVar12->m_variance = local_68;
  if ((1 < (pvVar12->m_vectors).m_size) && (0.0 < local_68)) {
    insert_heap((clusterizer<crnlib::vec<2U,_float>_> *)local_b8._8_8_,uVar16);
  }
  if (pvVar9 != (vq_node *)local_c0) {
    (pvVar9->m_centroid).m_s[0] = (float)local_c0._0_4_;
    (pvVar9->m_centroid).m_s[1] = (float)local_c0._4_4_;
  }
  pvVar9->m_total_weight = uVar15;
  puVar6 = (pvVar9->m_vectors).m_p;
  (pvVar9->m_vectors).m_p = ((vector<unsigned_int> *)(local_b8._8_8_ + 0x60))->m_p;
  ((vector<unsigned_int> *)(local_b8._8_8_ + 0x60))->m_p = puVar6;
  uVar4 = (pvVar9->m_vectors).m_size;
  (pvVar9->m_vectors).m_size = ((vector<unsigned_int> *)(local_b8._8_8_ + 0x60))->m_size;
  ((vector<unsigned_int> *)(local_b8._8_8_ + 0x60))->m_size = uVar4;
  uVar4 = (pvVar9->m_vectors).m_capacity;
  (pvVar9->m_vectors).m_capacity = ((vector<unsigned_int> *)(local_b8._8_8_ + 0x60))->m_capacity;
  ((vector<unsigned_int> *)(local_b8._8_8_ + 0x60))->m_capacity = uVar4;
  pvVar9->m_variance = local_58;
  if ((0.0 < local_58) && (1 < (pvVar9->m_vectors).m_size)) {
    insert_heap((clusterizer<crnlib::vec<2U,_float>_> *)local_b8._8_8_,uVar14);
  }
  return;
}

Assistant:

training_vec_array& get_training_vecs()
        {
            return m_training_vecs;
        }